

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O0

PortConnectionSyntax * __thiscall
slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::operator[]
          (SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *this,size_t index)

{
  reference this_00;
  SyntaxNode *this_01;
  PortConnectionSyntax *pPVar1;
  size_t index_local;
  SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *this_local;
  
  this_00 = nonstd::span_lite::span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>::
            operator[](&this->elements,index << 1);
  this_01 = TokenOrSyntax::node(this_00);
  pPVar1 = SyntaxNode::as<slang::syntax::PortConnectionSyntax>(this_01);
  return pPVar1;
}

Assistant:

const T* operator[](size_t index) const {
        index <<= 1;
        return &elements[index].node()->template as<T>();
    }